

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall QGraphicsItem::childItems(QGraphicsItem *this)

{
  QList<QGraphicsItem_*> *in_RSI;
  QList<QGraphicsItem_*> *in_RDI;
  QGraphicsItemPrivate *unaff_retaddr;
  QList<QGraphicsItem_*> *this_00;
  
  this_00 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &(in_RSI->d).ptr);
  QGraphicsItemPrivate::ensureSortedChildren(unaff_retaddr);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &(in_RSI->d).ptr);
  QList<QGraphicsItem_*>::QList(this_00,in_RSI);
  return in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsItem::childItems() const
{
    const_cast<QGraphicsItem *>(this)->d_ptr->ensureSortedChildren();
    return d_ptr->children;
}